

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RAWToYJRow_SSSE3(uint8_t *src_raw,uint8_t *dst_yj,int width)

{
  int in_EDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  int twidth;
  uint8_t row [8192];
  int local_2068;
  uint8_t local_2060 [8220];
  int local_44;
  uint8_t *local_40;
  uint8_t *local_38;
  
  local_40 = in_RSI;
  local_38 = in_RDI;
  for (local_44 = in_EDX; 0 < local_44; local_44 = local_44 - local_2068) {
    if (local_44 < 0x801) {
      local_2068 = local_44;
    }
    else {
      local_2068 = 0x800;
    }
    RAWToARGBRow_SSSE3(local_38,local_2060,local_2068);
    ARGBToYJRow_SSSE3(local_2060,local_40,local_2068);
    local_38 = local_38 + local_2068 * 3;
    local_40 = local_40 + local_2068;
  }
  return;
}

Assistant:

void RAWToYJRow_SSSE3(const uint8_t* src_raw, uint8_t* dst_yj, int width) {
  // Row buffer for intermediate ARGB pixels.
  SIMD_ALIGNED(uint8_t row[MAXTWIDTH * 4]);
  while (width > 0) {
    int twidth = width > MAXTWIDTH ? MAXTWIDTH : width;
    RAWToARGBRow_SSSE3(src_raw, row, twidth);
    ARGBToYJRow_SSSE3(row, dst_yj, twidth);
    src_raw += twidth * 3;
    dst_yj += twidth;
    width -= twidth;
  }
}